

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::enforceOk
          (BasicResult<Catch::clara::detail::ParseResultType> *this)

{
  BasicResult<Catch::clara::detail::ParseResultType> *this_local;
  
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
      == LogicError) {
    __assert_fail("m_type != ResultBase::LogicError",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/Catch2/single_include/catch2/catch.hpp"
                  ,0x233f,
                  "virtual void Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::enforceOk() const [T = Catch::clara::detail::ParseResultType]"
                 );
  }
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
      != RuntimeError) {
    if ((this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
        != Ok) {
      abort();
    }
    return;
  }
  __assert_fail("m_type != ResultBase::RuntimeError",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/Catch2/single_include/catch2/catch.hpp"
                ,0x2340,
                "virtual void Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::enforceOk() const [T = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }